

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::ChLinkPointFrameGeneric
          (ChLinkPointFrameGeneric *this,ChLinkPointFrameGeneric *other)

{
  undefined1 auVar1 [32];
  
  ChLinkBase::ChLinkBase(&this->super_ChLinkBase,&other->super_ChLinkBase);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkPointFrameGeneric_00b50050;
  (this->m_react).m_data[0] = 0.0;
  (this->m_react).m_data[1] = 0.0;
  (this->m_react).m_data[2] = 0.0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint1).super_ChConstraintTwo.variables_a = (ChVariables *)0x0;
  (this->constraint1).super_ChConstraintTwo.variables_b = (ChVariables *)0x0;
  (this->constraint1).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  (this->constraint1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint1).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint1).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint1).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraint_00b629f0;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint2).super_ChConstraintTwo.variables_a = (ChVariables *)0x0;
  (this->constraint2).super_ChConstraintTwo.variables_b = (ChVariables *)0x0;
  (this->constraint2).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  (this->constraint2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint2).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint2).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint2).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraint_00b629f0;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint3).super_ChConstraintTwo.variables_a = (ChVariables *)0x0;
  (this->constraint3).super_ChConstraintTwo.variables_b = (ChVariables *)0x0;
  (this->constraint3).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  (this->constraint3).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint3).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint3).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint3).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint3).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint3).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_csys).pos.m_data[0] = 0.0;
  (this->m_csys).pos.m_data[1] = 0.0;
  (this->m_csys).pos.m_data[2] = 0.0;
  (this->m_csys).rot.m_data[0] = 1.0;
  (this->m_csys).rot.m_data[1] = 0.0;
  (this->m_csys).rot.m_data[2] = 0.0;
  (this->m_csys).rot.m_data[3] = 0.0;
  if (other != this) {
    (this->m_csys).pos.m_data[0] = (other->m_csys).pos.m_data[0];
    (this->m_csys).pos.m_data[1] = (other->m_csys).pos.m_data[1];
    (this->m_csys).pos.m_data[2] = (other->m_csys).pos.m_data[2];
    (this->m_csys).rot.m_data[0] = (other->m_csys).rot.m_data[0];
    (this->m_csys).rot.m_data[1] = (other->m_csys).rot.m_data[1];
    (this->m_csys).rot.m_data[2] = (other->m_csys).rot.m_data[2];
    (this->m_csys).rot.m_data[3] = (other->m_csys).rot.m_data[3];
    (this->m_react).m_data[0] = (other->m_react).m_data[0];
    (this->m_react).m_data[1] = (other->m_react).m_data[1];
    (this->m_react).m_data[2] = (other->m_react).m_data[2];
  }
  this->c_x = other->c_x;
  this->c_y = other->c_y;
  this->c_z = other->c_z;
  return;
}

Assistant:

ChLinkPointFrameGeneric::ChLinkPointFrameGeneric(const ChLinkPointFrameGeneric& other) : ChLinkBase(other) {
    m_csys = other.m_csys;
    m_react = other.m_react;
    c_x = other.c_x;
    c_y = other.c_y;
    c_z = other.c_z;
}